

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

ComponentPtr
libcellml::flattenComponent(ComponentEntityPtr *parent,ComponentPtr *component,size_t index)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  __type _Var5;
  size_t sVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  _Base_ptr p_Var8;
  iterator iVar9;
  int __flags;
  size_t in_RCX;
  IndexStack *destinationStack;
  void *__child_stack;
  ModelPtr *model_00;
  void *__child_stack_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> component_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  size_t value;
  pointer psVar10;
  libcellml *this;
  ulong uVar11;
  __shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  ComponentPtr *in_R8;
  ComponentPtr *in_R9;
  __shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *p_Var13;
  UnitsPtr *pUVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  pointer psVar18;
  ModelPtr MVar19;
  ComponentPtr CVar20;
  ComponentPtr importedComponentCopy;
  ModelPtr clonedImportModel;
  StringStringMap unitNamesToReplace;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  uniqueRequiredUnits;
  ComponentPtr importedComponent;
  VariablePtr localModelVariable;
  string newName;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_240;
  UnitsPtr flattenedUnits;
  ModelPtr flatModel;
  ModelPtr importModel;
  ComponentNameMap newComponentNames;
  StringStringMap aliasedUnitsNames;
  undefined1 local_150 [16];
  UnitsPtr foundUnits;
  ModelPtr requiredUnitsModel;
  EquivalenceMap map;
  IndexStack importedComponentBaseIndexStack;
  NameList compNames;
  ImportSourcePtr importSource;
  ModelPtr model;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  requiredUnits;
  __shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> local_88;
  IndexStack destinationComponentBaseIndexStack;
  EquivalenceMap rebasedMap;
  
  bVar4 = ImportedEntity::isImport((ImportedEntity *)(*(long *)index + 0x10));
  if (bVar4) {
    std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Component,void>
              ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)&map,
               (__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)index);
    owningModel((ParentedEntityConstPtr *)&model);
    p_Var1 = &map._M_t._M_impl.super__Rb_tree_header;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)p_Var1);
    ImportedEntity::importSource((ImportedEntity *)&importSource);
    ImportSource::model((ImportSource *)&importModel);
    peVar3 = importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ImportedEntity::importReference_abi_cxx11_
              ((string *)&map,(ImportedEntity *)(*(long *)index + 0x10));
    __flags = 1;
    ComponentEntity::component((ComponentEntity *)&importedComponent,(string *)peVar3,SUB81(&map,0))
    ;
    std::__cxx11::string::~string((string *)&map);
    Model::clone((Model *)&clonedImportModel,
                 (__fn *)importModel.
                         super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 __child_stack,__flags,in_R8);
    componentNames_abi_cxx11_(&compNames,(libcellml *)&model,model_00);
    indexStackOf(&destinationComponentBaseIndexStack,(ComponentPtr *)index);
    indexStackOf(&importedComponentBaseIndexStack,&importedComponent);
    map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    recordVariableEquivalences(&importedComponent,&map,&importedComponentBaseIndexStack);
    generateEquivalenceMap(&importedComponent,&map,&importedComponentBaseIndexStack);
    destinationStack = &destinationComponentBaseIndexStack;
    rebaseEquivalenceMap(&rebasedMap,&map,&importedComponentBaseIndexStack,destinationStack);
    Component::clone((Component *)&importedComponentCopy,
                     (__fn *)importedComponent.
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,__child_stack_00,(int)destinationStack,in_R8);
    peVar2 = importedComponentCopy.
             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    NamedEntity::name_abi_cxx11_((string *)&aliasedUnitsNames,*(NamedEntity **)index);
    NamedEntity::setName((NamedEntity *)peVar2,(string *)&aliasedUnitsNames);
    std::__cxx11::string::~string((string *)&aliasedUnitsNames);
    for (uVar16 = 0; sVar6 = ComponentEntity::componentCount(*(ComponentEntity **)index),
        peVar2 = importedComponentCopy.
                 super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        uVar16 < sVar6; uVar16 = uVar16 + 1) {
      ComponentEntity::component((ComponentEntity *)&aliasedUnitsNames,*(size_t *)index);
      ComponentEntity::addComponent
                (&peVar2->super_ComponentEntity,(ComponentPtr *)&aliasedUnitsNames);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header);
    }
    std::__shared_ptr<libcellml::Component_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Component,void>
              ((__shared_ptr<libcellml::Component_const,(__gnu_cxx::_Lock_policy)2> *)
               &aliasedUnitsNames,
               &importedComponentCopy.
                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
    unitsUsed(&requiredUnits,&clonedImportModel,(ComponentConstPtr *)&aliasedUnitsNames);
    p_Var1 = &aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)p_Var1);
    uniqueRequiredUnits.
    super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uniqueRequiredUnits.
    super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uniqueRequiredUnits.
    super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var13 = &(requiredUnits.
                super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
    aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; psVar18 = uniqueRequiredUnits.
                     super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
        psVar10 = uniqueRequiredUnits.
                  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        p_Var13 !=
        &(requiredUnits.
          super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->
         super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>; p_Var13 = p_Var13 + 1) {
      std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_88,p_Var13);
      std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&newName,&local_88);
      std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&newComponentNames,
                 (__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&newName);
      std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&unitNamesToReplace,
                 (__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&newComponentNames);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &newComponentNames._M_t._M_impl.super__Rb_tree_header);
      std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&newComponentNames,
                 (__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&unitNamesToReplace);
      lVar15 = (long)psVar18 - (long)psVar10;
      for (lVar17 = lVar15 >> 6; 0 < lVar17; lVar17 = lVar17 + -1) {
        bVar4 = Units::equivalent(psVar10,(UnitsPtr *)&newComponentNames);
        pUVar14 = psVar10;
        if (bVar4) goto LAB_001f125b;
        bVar4 = Units::equivalent(psVar10 + 1,(UnitsPtr *)&newComponentNames);
        pUVar14 = psVar10 + 1;
        if (bVar4) goto LAB_001f125b;
        bVar4 = Units::equivalent(psVar10 + 2,(UnitsPtr *)&newComponentNames);
        pUVar14 = psVar10 + 2;
        if (bVar4) goto LAB_001f125b;
        bVar4 = Units::equivalent(psVar10 + 3,(UnitsPtr *)&newComponentNames);
        pUVar14 = psVar10 + 3;
        if (bVar4) goto LAB_001f125b;
        psVar10 = psVar10 + 4;
        lVar15 = lVar15 + -0x40;
      }
      lVar15 = lVar15 >> 4;
      if (lVar15 == 1) {
LAB_001f1324:
        bVar4 = Units::equivalent(psVar10,(UnitsPtr *)&newComponentNames);
        pUVar14 = psVar18;
        if (bVar4) {
          pUVar14 = psVar10;
        }
      }
      else if (lVar15 == 2) {
LAB_001f122c:
        bVar4 = Units::equivalent(psVar10,(UnitsPtr *)&newComponentNames);
        pUVar14 = psVar10;
        if (!bVar4) {
          psVar10 = psVar10 + 1;
          goto LAB_001f1324;
        }
      }
      else {
        pUVar14 = psVar18;
        if ((lVar15 == 3) &&
           (bVar4 = Units::equivalent(psVar10,(UnitsPtr *)&newComponentNames), pUVar14 = psVar10,
           !bVar4)) {
          psVar10 = psVar10 + 1;
          goto LAB_001f122c;
        }
      }
LAB_001f125b:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &newComponentNames._M_t._M_impl.super__Rb_tree_header);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &unitNamesToReplace._M_t._M_impl.super__Rb_tree_header);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newName._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
      if (pUVar14 ==
          uniqueRequiredUnits.
          super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ::push_back(&uniqueRequiredUnits,(value_type *)p_Var13);
      }
      else {
        NamedEntity::name_abi_cxx11_
                  ((string *)&newComponentNames,
                   &((pUVar14->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_NamedEntity);
        NamedEntity::name_abi_cxx11_
                  ((string *)&unitNamesToReplace,&p_Var13->_M_ptr->super_NamedEntity);
        bVar4 = std::operator!=((string *)&newComponentNames,(string *)&unitNamesToReplace);
        std::__cxx11::string::~string((string *)&unitNamesToReplace);
        std::__cxx11::string::~string((string *)&newComponentNames);
        if (bVar4) {
          NamedEntity::name_abi_cxx11_
                    ((string *)&newComponentNames,&p_Var13->_M_ptr->super_NamedEntity);
          NamedEntity::name_abi_cxx11_
                    ((string *)&unitNamesToReplace,
                     &((pUVar14->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_NamedEntity);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&aliasedUnitsNames,(string *)&newComponentNames,
                     (string *)&unitNamesToReplace);
          std::__cxx11::string::~string((string *)&unitNamesToReplace);
          std::__cxx11::string::~string((string *)&newComponentNames);
        }
      }
    }
    MVar19 = Model::create();
    psVar10 = uniqueRequiredUnits.
              super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    component_00 = MVar19.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    for (psVar18 = uniqueRequiredUnits.
                   super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        peVar3 = requiredUnitsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr, psVar18 != psVar10; psVar18 = psVar18 + 1) {
      Units::clone((Units *)&newComponentNames,
                   (__fn *)(psVar18->
                           super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   component_00._M_pi,(int)destinationStack,in_R8);
      Model::addUnits(peVar3,(UnitsPtr *)&newComponentNames);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &newComponentNames._M_t._M_impl.super__Rb_tree_header);
      component_00._M_pi = extraout_RDX;
    }
    createComponentNamesMap_abi_cxx11_
              (&newComponentNames,(libcellml *)&importedComponentCopy,
               (ComponentPtr *)component_00._M_pi);
    for (p_Var8 = newComponentNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &newComponentNames._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      std::__cxx11::string::string((string *)&unitNamesToReplace,(string *)(p_Var8 + 1));
      std::__cxx11::string::string((string *)&newName,(string *)&unitNamesToReplace);
      this = (libcellml *)0x1;
      while (_Var7 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                               (compNames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                compNames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&newName),
            _Var7._M_current !=
            compNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &flatModel,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &unitNamesToReplace,"_");
        convertToString_abi_cxx11_((string *)&flattenedUnits,this,value);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &localModelVariable,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &flatModel,(string *)&flattenedUnits);
        std::__cxx11::string::operator=((string *)&newName,(string *)&localModelVariable);
        std::__cxx11::string::~string((string *)&localModelVariable);
        std::__cxx11::string::~string((string *)&flattenedUnits);
        std::__cxx11::string::~string((string *)&flatModel);
        this = this + 1;
      }
      bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &unitNamesToReplace,&newName);
      if (bVar4) {
        NamedEntity::setName(*(NamedEntity **)(p_Var8 + 2),&newName);
      }
      std::__cxx11::string::~string((string *)&newName);
      std::__cxx11::string::~string((string *)&unitNamesToReplace);
    }
    for (uVar16 = 0; sVar6 = Component::variableCount(*(Component **)index), uVar16 < sVar6;
        uVar16 = uVar16 + 1) {
      Component::variable((Component *)&newName,*(size_t *)index);
      for (uVar11 = 0;
          sVar6 = Variable::equivalentVariableCount((Variable *)newName._M_dataplus._M_p),
          uVar11 < sVar6; uVar11 = uVar11 + 1) {
        Variable::equivalentVariable
                  ((Variable *)&localModelVariable,(size_t)newName._M_dataplus._M_p);
        peVar2 = importedComponentCopy.
                 super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        NamedEntity::name_abi_cxx11_
                  ((string *)&unitNamesToReplace,(NamedEntity *)newName._M_dataplus._M_p);
        Component::variable((Component *)&flatModel,(string *)peVar2);
        std::__cxx11::string::~string((string *)&unitNamesToReplace);
        Variable::addEquivalence((VariablePtr *)&flatModel,&localModelVariable);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&localModelVariable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newName._M_string_length);
    }
    ComponentEntity::replaceComponent
              (&((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ComponentEntity,in_RCX,&importedComponentCopy);
    std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Component,void>
              ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
               &unitNamesToReplace,
               &importedComponentCopy.
                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
    owningModel((ParentedEntityConstPtr *)&flatModel);
    p_Var1 = &unitNamesToReplace._M_t._M_impl.super__Rb_tree_header;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)p_Var1);
    applyEquivalenceMapToModel(&rebasedMap,&flatModel);
    psVar10 = uniqueRequiredUnits.
              super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    unitNamesToReplace._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    unitNamesToReplace._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    unitNamesToReplace._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var13 = &(uniqueRequiredUnits.
                super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
    unitNamesToReplace._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    unitNamesToReplace._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; p_Var13 != &psVar10->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
        p_Var13 = p_Var13 + 1) {
      flattenedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      flattenedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar4 = ImportedEntity::isImport(&p_Var13->_M_ptr->super_ImportedEntity);
      peVar3 = clonedImportModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (bVar4) {
        NamedEntity::name_abi_cxx11_(&newName,&p_Var13->_M_ptr->super_NamedEntity);
        Model::units((Model *)&foundUnits,(string *)peVar3);
        std::__cxx11::string::~string((string *)&newName);
        pUVar14 = (UnitsPtr *)0x0;
        while (flattenedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr == (element_type *)0x0) {
          NamedEntity::name_abi_cxx11_
                    (&newName,&(foundUnits.
                                super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_NamedEntity);
          Model::units((Model *)local_150,
                       (size_t)clonedImportModel.
                               super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
          NamedEntity::name_abi_cxx11_((string *)&localModelVariable,(NamedEntity *)local_150._0_8_)
          ;
          _Var5 = std::operator==(&newName,(string *)&localModelVariable);
          std::__cxx11::string::~string((string *)&localModelVariable);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 8));
          std::__cxx11::string::~string((string *)&newName);
          if (_Var5) {
            flattenUnitsImports((libcellml *)&clonedImportModel,(ModelPtr *)p_Var13,pUVar14,
                                (size_t)&importedComponentCopy,in_R8);
            Model::units((Model *)&newName,
                         (size_t)clonedImportModel.
                                 super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
            std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&flattenedUnits.
                        super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&newName);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newName._M_string_length);
          }
          pUVar14 = (UnitsPtr *)
                    ((long)&(pUVar14->
                            super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    + 1);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&foundUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      p_Var12 = &flattenedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
      if (flattenedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        p_Var12 = p_Var13;
      }
      std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&localModelVariable,
                 p_Var12);
      for (uVar16 = 0;
          sVar6 = Units::unitCount((Units *)localModelVariable.
                                            super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr), uVar16 < sVar6; uVar16 = uVar16 + 1) {
        Units::unitAttributeReference_abi_cxx11_
                  (&newName,(Units *)localModelVariable.
                                     super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,uVar16);
        for (p_Var8 = unitNamesToReplace._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != p_Var1; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)
            ) {
          _Var5 = std::operator==(&newName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(p_Var8 + 1));
          if (_Var5) {
            Units::setUnitAttributeReference
                      ((Units *)localModelVariable.
                                super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,uVar16,(string *)(p_Var8 + 2));
          }
        }
        std::__cxx11::string::~string((string *)&newName);
      }
      in_R8 = &importedComponentCopy;
      transferUnitsRenamingIfRequired_abi_cxx11_
                ((StringStringMap *)&newName,(libcellml *)&clonedImportModel,&flatModel,
                 (ModelPtr *)&localModelVariable,(UnitsPtr *)in_R8,in_R9);
      if (local_240._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_merge_unique<std::less<std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&unitNamesToReplace,
                   (_Compatible_tree<std::less<std::__cxx11::basic_string<char>_>_> *)&newName);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&newName);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&localModelVariable.
                  super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&flattenedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    for (p_Var8 = aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      std::__cxx11::string::string((string *)&newName,(string *)(p_Var8 + 2));
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&unitNamesToReplace._M_t,&newName);
      if ((_Rb_tree_header *)iVar9._M_node != p_Var1) {
        std::__cxx11::string::_M_assign((string *)&newName);
      }
      Model::units((Model *)&localModelVariable,
                   (string *)
                   flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  );
      updateUnitsNameUsages
                ((string *)(p_Var8 + 1),&newName,&importedComponentCopy,
                 (UnitsPtr *)&localModelVariable);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&localModelVariable.
                  super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&newName);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&unitNamesToReplace._M_t);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
    ::~_Rb_tree(&newComponentNames._M_t);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&requiredUnitsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&aliasedUnitsNames._M_t);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector(&uniqueRequiredUnits);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector(&requiredUnits);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&importedComponentCopy.
                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    _Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::~_Rb_tree(&rebasedMap._M_t);
    std::
    _Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::~_Rb_tree(&map._M_t);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&importedComponentBaseIndexStack.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&destinationComponentBaseIndexStack.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&compNames);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&clonedImportModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&importedComponent.
                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  CVar20 = ComponentEntity::component
                     ((ComponentEntity *)parent,
                      (size_t)(component->
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
  CVar20.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)parent;
  return (ComponentPtr)CVar20.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr flattenComponent(const ComponentEntityPtr &parent, ComponentPtr &component, size_t index)
{
    if (component->isImport()) {
        auto model = owningModel(component);
        auto importSource = component->importSource();
        auto importModel = importSource->model();
        auto importedComponent = importModel->component(component->importReference());
        // Clone import model to not affect origin import model units.
        auto clonedImportModel = importModel->clone();

        NameList compNames = componentNames(model);

        // Determine the stack for the destination component.
        IndexStack destinationComponentBaseIndexStack = indexStackOf(component);

        // Determine the stack for the source component.
        IndexStack importedComponentBaseIndexStack = indexStackOf(importedComponent);

        // Generate equivalence map for the source component.
        EquivalenceMap map;
        recordVariableEquivalences(importedComponent, map, importedComponentBaseIndexStack);
        generateEquivalenceMap(importedComponent, map, importedComponentBaseIndexStack);

        // Rebase the generated equivalence map from the source component to the destination component.
        auto rebasedMap = rebaseEquivalenceMap(map, importedComponentBaseIndexStack, destinationComponentBaseIndexStack);

        // Take a copy of the imported component which will be used to replace the import defined in this model.
        auto importedComponentCopy = importedComponent->clone();
        importedComponentCopy->setName(component->name());
        for (size_t i = 0; i < component->componentCount(); ++i) {
            importedComponentCopy->addComponent(component->component(i));
        }

        // Get list of required units from component's variables and math cn elements.
        std::vector<UnitsPtr> requiredUnits = unitsUsed(clonedImportModel, importedComponentCopy);

        std::vector<UnitsPtr> uniqueRequiredUnits;
        StringStringMap aliasedUnitsNames;
        for (const auto &units : requiredUnits) {
            const auto iterator = std::find_if(uniqueRequiredUnits.begin(), uniqueRequiredUnits.end(),
                                               [=](const UnitsPtr &u) -> bool { return Units::equivalent(u, units); });
            if (iterator == uniqueRequiredUnits.end()) {
                uniqueRequiredUnits.push_back(units);
            } else if ((*iterator)->name() != units->name()) {
                aliasedUnitsNames.emplace(units->name(), (*iterator)->name());
            }
        }

        // Add all required units to a model so referenced units can be resolved.
        auto requiredUnitsModel = Model::create();
        for (const auto &units : uniqueRequiredUnits) {
            // Cloning units present elsewhere so that they don't get moved by the addUnits function.
            requiredUnitsModel->addUnits(units->clone());
        }

        // Make a map of component name to component pointer.
        ComponentNameMap newComponentNames = createComponentNamesMap(importedComponentCopy);
        for (const auto &entry : newComponentNames) {
            std::string originalName = entry.first;
            size_t count = 0;
            std::string newName = originalName;
            while (std::find(compNames.begin(), compNames.end(), newName) != compNames.end()) {
                newName = originalName + "_" + convertToString(++count);
            }
            if (originalName != newName) {
                entry.second->setName(newName);
            }
        }

        // If the component 'component' has variables then they are equivalent variables and they
        // need to be exchanged with the real variables from the component 'importedComponent'.
        for (size_t i = 0; i < component->variableCount(); ++i) {
            auto placeholderVariable = component->variable(i);
            for (size_t j = 0; j < placeholderVariable->equivalentVariableCount(); ++j) {
                auto localModelVariable = placeholderVariable->equivalentVariable(j);
                auto importedComponentVariable = importedComponentCopy->variable(placeholderVariable->name());
                Variable::addEquivalence(importedComponentVariable, localModelVariable);
            }
        }
        parent->replaceComponent(index, importedComponentCopy);
        auto flatModel = owningModel(importedComponentCopy);

        // Apply the re-based equivalence map onto the modified model.
        applyEquivalenceMapToModel(rebasedMap, flatModel);

        StringStringMap unitNamesToReplace;
        for (const auto &units : uniqueRequiredUnits) {
            // If the required units are imported units, we will resolve those units here.
            size_t unitsIndex = 0;
            UnitsPtr flattenedUnits = nullptr;
            if (units->isImport()) {
                auto foundUnits = clonedImportModel->units(units->name());
                while (flattenedUnits == nullptr) {
                    if (foundUnits->name() == clonedImportModel->units(unitsIndex)->name()) {
                        flattenUnitsImports(clonedImportModel, units, unitsIndex, importedComponentCopy);
                        flattenedUnits = clonedImportModel->units(unitsIndex);
                    }
                    unitsIndex += 1;
                }
            }

            auto replacementUnits = (flattenedUnits != nullptr) ? flattenedUnits : units;

            for (size_t unitIndex = 0; unitIndex < replacementUnits->unitCount(); ++unitIndex) {
                const std::string ref = replacementUnits->unitAttributeReference(unitIndex);
                for (const auto &entry : unitNamesToReplace) {
                    if (ref == entry.first) {
                        replacementUnits->setUnitAttributeReference(unitIndex, entry.second);
                    }
                }
            }
            StringStringMap changedNames = transferUnitsRenamingIfRequired(clonedImportModel, flatModel, replacementUnits, importedComponentCopy);
            if (!changedNames.empty()) {
                unitNamesToReplace.merge(changedNames);
            }
        }

        for (const auto &alias : aliasedUnitsNames) {
            std::string finalUnitsName = alias.second;
            const auto match = unitNamesToReplace.find(finalUnitsName);
            if (match != unitNamesToReplace.end()) {
                finalUnitsName = match->second;
            }
            UnitsPtr targetUnits = flatModel->units(finalUnitsName);
            updateUnitsNameUsages(alias.first, finalUnitsName, importedComponentCopy, targetUnits);
        }
    }

    return parent->component(index);
}